

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector_test.cpp
# Opt level: O0

void __thiscall
adt_vector_test_DefaultConstructor_Test::adt_vector_test_DefaultConstructor_Test
          (adt_vector_test_DefaultConstructor_Test *this)

{
  adt_vector_test *in_RDI;
  
  adt_vector_test::adt_vector_test(in_RDI);
  (in_RDI->super_Test)._vptr_Test =
       (_func_int **)&PTR__adt_vector_test_DefaultConstructor_Test_00183980;
  return;
}

Assistant:

TEST_F(adt_vector_test, DefaultConstructor)
{
	static const size_t capacity = 50;

	vector v = vector_create_reserve_type(size_t, capacity);

	ASSERT_EQ((size_t)vector_type_size(v), (size_t)sizeof(size_t));
	ASSERT_EQ((size_t)vector_size(v), (size_t)0);

	for (size_t i = 0; i < capacity; ++i)
	{
		vector_push_back_var(v, i);
	}

	ASSERT_EQ((size_t)vector_size(v), (size_t)capacity);

	for (size_t i = 0; i < capacity; ++i)
	{
		size_t current = vector_at_type(v, i, size_t);

		ASSERT_EQ((size_t)current, (size_t)i);
	}

	vector_destroy(v);
}